

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_byteArray_primitive_copyFromUntil
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong tuple;
  ulong uVar1;
  sysbvm_tuple_t type;
  sysbvm_object_tuple_t *psVar2;
  ulong uVar3;
  ulong uVar4;
  size_t byteSize;
  sysbvm_type_tuple_t *arrayTypeObject;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  tuple = *arguments;
  if ((tuple & 0xf) == 0 && tuple != 0) {
    uVar4 = (ulong)*(uint *)(tuple + 0xc);
  }
  else {
    uVar4 = 0;
  }
  uVar3 = arguments[1];
  if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
    uVar3 = (long)uVar3 >> 4;
  }
  else {
    uVar3 = *(ulong *)(uVar3 + 0x10);
  }
  uVar1 = arguments[2];
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    uVar1 = (long)uVar1 >> 4;
  }
  else {
    uVar1 = *(ulong *)(uVar1 + 0x10);
  }
  if (uVar1 < uVar4) {
    uVar4 = uVar1;
  }
  type = sysbvm_tuple_getType(context,tuple);
  if (uVar3 < uVar4) {
    byteSize = 0;
    if (uVar3 <= uVar4) {
      byteSize = uVar4 - uVar3;
    }
    psVar2 = sysbvm_context_allocateByteTuple(context,type,byteSize);
    memcpy(&psVar2->field_1,(void *)(tuple + uVar3 + 0x10),byteSize);
  }
  else {
    psVar2 = *(sysbvm_object_tuple_t **)(type + 0x78);
    if (psVar2 == (sysbvm_object_tuple_t *)0x0) {
      psVar2 = sysbvm_context_allocateByteTuple(context,type,0);
      *(sysbvm_object_tuple_t **)(type + 0x78) = psVar2;
    }
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_copyFromUntil(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t startIndex = sysbvm_tuple_size_decode(arguments[1]);
    size_t endIndex = sysbvm_tuple_size_decode(arguments[2]);
    if(endIndex >= size)
        endIndex = size;
    
    size_t copySize = startIndex <= endIndex ? endIndex - startIndex : 0;
    sysbvm_tuple_t arrayType = sysbvm_tuple_getType(context, arguments[0]);

    if(copySize == 0)
    {
        sysbvm_type_tuple_t *arrayTypeObject = (sysbvm_type_tuple_t*)arrayType;
        if(!arrayTypeObject->emptyTrivialSingleton)
            arrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, arrayType, 0);
        return arrayTypeObject->emptyTrivialSingleton;
    }

    sysbvm_byteArray_t *copy = (sysbvm_byteArray_t *)sysbvm_context_allocateByteTuple(context, arrayType, copySize);

    memcpy(copy->elements, array->elements + startIndex, copySize);
    return (sysbvm_tuple_t)copy;
}